

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testProcrustesImp<float>(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  size_t numPoints;
  float __x;
  float fVar7;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> toPoints;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> fromPoints;
  Rand48 random;
  Matrix44<double> tmp;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> local_298;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> local_278;
  ushort local_25e [3];
  undefined1 local_258 [4];
  float fStack_254;
  float fStack_250;
  uint uStack_24c;
  double dStack_248;
  double dStack_240;
  double local_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  undefined1 auStack_1c8 [12];
  uint uStack_1bc;
  undefined1 auStack_1b8 [8];
  double local_1b0;
  undefined1 auStack_1a8 [16];
  undefined1 auStack_198 [16];
  undefined1 auStack_188 [16];
  undefined1 auStack_178 [16];
  undefined1 auStack_168 [8];
  double local_160;
  Euler<double> local_158;
  Matrix44<double> local_138;
  M44d local_b8;
  
  Imath_2_5::procrustesRotationAndTranslation<float>
            (&local_b8,(Vec3<float> *)0x0,(Vec3<float> *)0x0,(float *)0x0,0,false);
  auStack_178 = ZEXT816(0);
  auStack_1a8 = ZEXT816(0);
  auStack_198 = ZEXT816(0);
  _auStack_1c8 = ZEXT816(0);
  _local_1d8 = ZEXT816(0x3ff0000000000000);
  auStack_1b8 = (undefined1  [8])0x0;
  local_1b0 = 1.0;
  auStack_188 = ZEXT816(0x3ff0000000000000);
  auStack_168 = (undefined1  [8])0x0;
  local_160 = 1.0;
  bVar4 = Imath_2_5::Matrix44<double>::operator==(&local_b8,(Matrix44<double> *)local_1d8);
  if (!bVar4) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,0x127,"void testProcrustesImp() [T = float]");
  }
  Imath_2_5::procrustesRotationAndTranslation<float>
            ((M44d *)local_1d8,(Vec3<float> *)0x0,(Vec3<float> *)0x0,0,false);
  local_b8.x[0][0] = (double)local_1d8;
  local_b8.x[0][1] = uStack_1d0;
  local_b8.x[0][2] = (double)auStack_1c8._0_8_;
  local_b8.x[0][3] = stack0xfffffffffffffe40;
  local_b8.x[1][0] = (double)auStack_1b8;
  local_b8.x[1][1] = local_1b0;
  local_b8.x[1][2] = (double)auStack_1a8._0_8_;
  local_b8.x[1][3] = (double)auStack_1a8._8_8_;
  local_b8.x[2][0] = (double)auStack_198._0_8_;
  local_b8.x[2][1] = (double)auStack_198._8_8_;
  local_b8.x[2][2] = (double)auStack_188._0_8_;
  local_b8.x[2][3] = (double)auStack_188._8_8_;
  local_b8.x[3][0] = (double)auStack_178._0_8_;
  local_b8.x[3][1] = (double)auStack_178._8_8_;
  local_b8.x[3][2] = (double)auStack_168;
  local_b8.x[3][3] = local_160;
  auStack_178 = ZEXT816(0);
  auStack_1a8 = ZEXT816(0);
  auStack_198 = ZEXT816(0);
  _auStack_1c8 = ZEXT816(0);
  _local_1d8 = ZEXT816(0x3ff0000000000000);
  _auStack_1b8 = ZEXT816(0x3ff0000000000000) << 0x40;
  auStack_188 = ZEXT816(0x3ff0000000000000);
  auStack_168 = (undefined1  [8])0x0;
  local_160 = 1.0;
  bVar4 = Imath_2_5::Matrix44<double>::operator==(&local_b8,(Matrix44<double> *)local_1d8);
  if (bVar4) {
    auStack_178 = ZEXT816(0);
    auStack_1a8 = ZEXT816(0);
    auStack_198 = ZEXT816(0);
    _auStack_1c8 = ZEXT816(0);
    _local_1d8 = ZEXT816(0x3ff0000000000000);
    auStack_1b8 = (undefined1  [8])0x0;
    local_1b0 = 1.0;
    auStack_188 = ZEXT816(0x3ff0000000000000);
    auStack_168 = (undefined1  [8])0x0;
    local_160 = 1.0;
    testTranslationRotationMatrix<float>((M44d *)local_1d8);
    dVar3 = (double)auStack_198._8_8_ * -0.2 + uStack_1d0 * 3.0 + local_1b0 * 5.0 +
            (double)auStack_178._8_8_;
    auStack_178._8_4_ = SUB84(dVar3,0);
    auStack_178._0_8_ =
         (double)auStack_198._0_8_ * -0.2 + (double)local_1d8 * 3.0 + (double)auStack_1b8 * 5.0 +
         (double)auStack_178._0_8_;
    auStack_178._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_188._8_8_ * -0.2 +
            stack0xfffffffffffffe40 * 3.0 + (double)auStack_1a8._8_8_ * 5.0 + local_160;
    unique0x10001516 = SUB84(dVar3,0);
    auStack_168 = (undefined1  [8])
                  ((double)auStack_188._0_8_ * -0.2 +
                   (double)auStack_1c8._0_8_ * 3.0 + (double)auStack_1a8._0_8_ * 5.0 +
                  (double)auStack_168);
    unique0x1000151a = (int)((ulong)dVar3 >> 0x20);
    testTranslationRotationMatrix<float>((M44d *)local_1d8);
    local_258 = (undefined1  [4])0x54442d18;
    fStack_254 = 2.142699;
    fStack_250 = 0.0;
    uStack_24c = 0;
    dStack_248 = 0.0;
    Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)local_258);
    testTranslationRotationMatrix<float>((M44d *)local_1d8);
    local_258 = (undefined1  [4])0x0;
    fStack_254 = 0.0;
    fStack_250 = 3.3702806e+12;
    uStack_24c = 0x3fe921fb;
    lVar6 = 0;
    dStack_248 = 0.0;
    Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)local_258);
    testTranslationRotationMatrix<float>((M44d *)local_1d8);
    local_258 = (undefined1  [4])0x0;
    fStack_254 = 0.0;
    fStack_250 = 0.0;
    uStack_24c = 0;
    dStack_248 = -2.356194490192345;
    Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)local_258);
    testTranslationRotationMatrix<float>((M44d *)local_1d8);
    auStack_178 = ZEXT816(0);
    auStack_1a8 = ZEXT816(0);
    auStack_198 = ZEXT816(0);
    _auStack_1c8 = ZEXT816(0);
    _local_1d8 = ZEXT816(0x3ff0000000000000);
    auStack_1b8 = (undefined1  [8])0x0;
    local_1b0 = 1.0;
    auStack_188 = ZEXT816(0x3ff0000000000000);
    auStack_168 = (undefined1  [8])0x0;
    local_160 = 1.0;
    testWithTranslateRotateAndScale<float>((M44d *)local_1d8);
    auStack_178._8_8_ =
         (double)auStack_198._8_8_ * 10.0 + uStack_1d0 * 0.4 + local_1b0 * 6.0 +
         (double)auStack_178._8_8_;
    auStack_178._0_8_ =
         (double)auStack_198._0_8_ * 10.0 + (double)local_1d8 * 0.4 + (double)auStack_1b8 * 6.0 +
         (double)auStack_178._0_8_;
    dVar3 = (double)auStack_188._8_8_ * 10.0 +
            stack0xfffffffffffffe40 * 0.4 + (double)auStack_1a8._8_8_ * 6.0 + local_160;
    unique0x1000153a = SUB84(dVar3,0);
    auStack_168 = (undefined1  [8])
                  ((double)auStack_188._0_8_ * 10.0 +
                   (double)auStack_1c8._0_8_ * 0.4 + (double)auStack_1a8._0_8_ * 6.0 +
                  (double)auStack_168);
    unique0x1000153e = (int)((ulong)dVar3 >> 0x20);
    testWithTranslateRotateAndScale<float>((M44d *)local_1d8);
    local_258 = (undefined1  [4])0x54442d18;
    fStack_254 = 2.142699;
    fStack_250 = 0.0;
    uStack_24c = 0;
    dStack_248 = 0.0;
    Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)local_258);
    testWithTranslateRotateAndScale<float>((M44d *)local_1d8);
    local_258 = (undefined1  [4])0x0;
    fStack_254 = 0.0;
    fStack_250 = 3.3702806e+12;
    uStack_24c = 0x3fe921fb;
    dStack_248 = 0.0;
    Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)local_258);
    testWithTranslateRotateAndScale<float>((M44d *)local_1d8);
    local_258 = (undefined1  [4])0x0;
    fStack_254 = 0.0;
    fStack_250 = 0.0;
    uStack_24c = 0;
    dStack_248 = -2.356194490192345;
    Imath_2_5::Matrix44<double>::rotate<double>((M44d *)local_1d8,(Vec3<double> *)local_258);
    testWithTranslateRotateAndScale<float>((M44d *)local_1d8);
    dVar3 = uStack_1d0 + uStack_1d0;
    uStack_1d0._0_4_ = SUB84(dVar3,0);
    local_1d8 = (undefined1  [8])((double)local_1d8 + (double)local_1d8);
    uStack_1d0._4_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = stack0xfffffffffffffe40 + stack0xfffffffffffffe40;
    auStack_1c8._8_4_ = SUB84(dVar3,0);
    auStack_1c8._0_8_ = (double)auStack_1c8._0_8_ + (double)auStack_1c8._0_8_;
    uStack_1bc = (int)((ulong)dVar3 >> 0x20);
    dVar3 = local_1b0 + local_1b0;
    unique0x10001c12 = SUB84(dVar3,0);
    auStack_1b8 = (undefined1  [8])((double)auStack_1b8 + (double)auStack_1b8);
    unique0x10001c16 = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_1a8._8_8_ + (double)auStack_1a8._8_8_;
    auStack_1a8._8_4_ = SUB84(dVar3,0);
    auStack_1a8._0_8_ = (double)auStack_1a8._0_8_ + (double)auStack_1a8._0_8_;
    auStack_1a8._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_198._8_8_ + (double)auStack_198._8_8_;
    auStack_198._8_4_ = SUB84(dVar3,0);
    auStack_198._0_8_ = (double)auStack_198._0_8_ + (double)auStack_198._0_8_;
    auStack_198._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_188._8_8_ + (double)auStack_188._8_8_;
    auStack_188._8_4_ = SUB84(dVar3,0);
    auStack_188._0_8_ = (double)auStack_188._0_8_ + (double)auStack_188._0_8_;
    auStack_188._12_4_ = (int)((ulong)dVar3 >> 0x20);
    testWithTranslateRotateAndScale<float>((M44d *)local_1d8);
    dVar3 = uStack_1d0 * 0.01;
    uStack_1d0._0_4_ = SUB84(dVar3,0);
    local_1d8 = (undefined1  [8])((double)local_1d8 * 0.01);
    uStack_1d0._4_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = stack0xfffffffffffffe40 * 0.01;
    auStack_1c8._8_4_ = SUB84(dVar3,0);
    auStack_1c8._0_8_ = (double)auStack_1c8._0_8_ * 0.01;
    uStack_1bc = (int)((ulong)dVar3 >> 0x20);
    dVar3 = local_1b0 * 0.01;
    unique0x100015ca = SUB84(dVar3,0);
    auStack_1b8 = (undefined1  [8])((double)auStack_1b8 * 0.01);
    unique0x100015ce = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_1a8._8_8_ * 0.01;
    auStack_1a8._8_4_ = SUB84(dVar3,0);
    auStack_1a8._0_8_ = (double)auStack_1a8._0_8_ * 0.01;
    auStack_1a8._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_198._8_8_ * 0.01;
    auStack_198._8_4_ = SUB84(dVar3,0);
    auStack_198._0_8_ = (double)auStack_198._0_8_ * 0.01;
    auStack_198._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_188._8_8_ * 0.01;
    auStack_188._8_4_ = SUB84(dVar3,0);
    auStack_188._0_8_ = (double)auStack_188._0_8_ * 0.01;
    auStack_188._12_4_ = (int)((ulong)dVar3 >> 0x20);
    testWithTranslateRotateAndScale<float>((M44d *)local_1d8);
    local_278.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_278.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    do {
      __x = (float)lVar6 / 3.1415927;
      fVar7 = cosf(__x);
      fStack_254 = sinf(__x);
      fStack_250 = 0.0;
      local_258 = (undefined1  [4])fVar7;
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&local_278
                 ,(Vec3<float> *)local_258);
      dVar3 = cos((double)__x + 1.0471975511965976);
      dVar1 = sin((double)__x + 1.0471975511965976);
      local_258 = (undefined1  [4])(float)dVar3;
      fStack_254 = (float)dVar1;
      fStack_250 = 0.0;
      std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
      emplace_back<Imath_2_5::Vec3<float>>
                ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&local_298
                 ,(Vec3<float> *)local_258);
      lVar6 = lVar6 + 2;
    } while (lVar6 != 8);
    verifyProcrustes<float>(&local_278,&local_298);
    local_25e[0] = 0x7c67;
    local_25e[1] = 0x1005;
    local_25e[2] = 0x7c67;
    lVar6 = 1;
    do {
      if (local_278.
          super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_278.
          super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_278.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_278.
             super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      lVar5 = lVar6;
      if (local_298.
          super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_298.
          super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_298.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_298.
             super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      do {
        dVar3 = Imath_2_5::erand48(local_25e);
        dVar1 = Imath_2_5::erand48(local_25e);
        dVar2 = Imath_2_5::erand48(local_25e);
        local_258 = (undefined1  [4])(float)dVar3;
        fStack_254 = (float)dVar1;
        fStack_250 = (float)dVar2;
        std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
        emplace_back<Imath_2_5::Vec3<float>>
                  ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)
                   &local_278,(Vec3<float> *)local_258);
        dVar3 = Imath_2_5::erand48(local_25e);
        dVar1 = Imath_2_5::erand48(local_25e);
        dVar2 = Imath_2_5::erand48(local_25e);
        local_258 = (undefined1  [4])(float)dVar3;
        fStack_254 = (float)dVar1;
        fStack_250 = (float)dVar2;
        std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
        emplace_back<Imath_2_5::Vec3<float>>
                  ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)
                   &local_298,(Vec3<float> *)local_258);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    verifyProcrustes<float>(&local_278,&local_298);
    testProcrustesWithMatrix<float>((M44d *)local_1d8);
    dVar3 = uStack_1d0 * 3.0 + local_1b0 * 4.0 + (double)auStack_198._8_8_ +
            (double)auStack_178._8_8_;
    auStack_178._8_4_ = SUB84(dVar3,0);
    auStack_178._0_8_ =
         (double)local_1d8 * 3.0 + (double)auStack_1b8 * 4.0 + (double)auStack_198._0_8_ +
         (double)auStack_178._0_8_;
    auStack_178._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = stack0xfffffffffffffe40 * 3.0 + (double)auStack_1a8._8_8_ * 4.0 +
            (double)auStack_188._8_8_ + local_160;
    unique0x10001fea = SUB84(dVar3,0);
    auStack_168 = (undefined1  [8])
                  ((double)auStack_1c8._0_8_ * 3.0 + (double)auStack_1a8._0_8_ * 4.0 +
                   (double)auStack_188._0_8_ + (double)auStack_168);
    unique0x10001fee = (int)((ulong)dVar3 >> 0x20);
    testProcrustesWithMatrix<float>((M44d *)local_1d8);
    dVar3 = uStack_1d0 * -10.0 + local_1b0 + local_1b0 + (double)auStack_198._8_8_ +
            (double)auStack_178._8_8_;
    auStack_178._8_4_ = SUB84(dVar3,0);
    auStack_178._0_8_ =
         (double)local_1d8 * -10.0 + (double)auStack_1b8 + (double)auStack_1b8 +
         (double)auStack_198._0_8_ + (double)auStack_178._0_8_;
    auStack_178._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = stack0xfffffffffffffe40 * -10.0 + (double)auStack_1a8._8_8_ + (double)auStack_1a8._8_8_
            + (double)auStack_188._8_8_ + local_160;
    unique0x10001636 = SUB84(dVar3,0);
    auStack_168 = (undefined1  [8])
                  ((double)auStack_1c8._0_8_ * -10.0 +
                   (double)auStack_1a8._0_8_ + (double)auStack_1a8._0_8_ + (double)auStack_188._0_8_
                  + (double)auStack_168);
    unique0x1000163a = (int)((ulong)dVar3 >> 0x20);
    testProcrustesWithMatrix<float>((M44d *)local_1d8);
    local_158._24_1_ = local_158._24_1_ & 0xe0 | 5;
    local_158.super_Vec3<double>.x = 1.0471975511965976;
    local_158.super_Vec3<double>.y = 2.356194490192345;
    local_158.super_Vec3<double>.z = 0.0;
    Imath_2_5::Euler<double>::toMatrix44(&local_138,&local_158);
    local_1e8 = 0.0;
    dStack_1e0 = 0.0;
    local_1f8 = 0.0;
    dStack_1f0 = 0.0;
    local_208 = 0.0;
    dStack_200 = 0.0;
    local_218 = 0.0;
    dStack_210 = 0.0;
    local_228 = 0.0;
    dStack_220 = 0.0;
    local_238 = 0.0;
    dStack_230 = 0.0;
    dStack_248 = 0.0;
    dStack_240 = 0.0;
    local_258 = (undefined1  [4])0x0;
    fStack_254 = 0.0;
    fStack_250 = 0.0;
    uStack_24c = 0;
    Imath_2_5::Matrix44<double>::multiply
              ((Matrix44<double> *)local_1d8,&local_138,(Matrix44<double> *)local_258);
    local_1d8 = (undefined1  [8])CONCAT44(fStack_254,local_258);
    uStack_1d0 = (double)CONCAT44(uStack_24c,fStack_250);
    auStack_1c8._0_8_ = dStack_248;
    stack0xfffffffffffffe40 = dStack_240;
    auStack_1b8 = (undefined1  [8])local_238;
    local_1b0 = dStack_230;
    auStack_1a8._0_8_ = local_228;
    auStack_1a8._8_8_ = dStack_220;
    auStack_198._0_8_ = local_218;
    auStack_198._8_8_ = dStack_210;
    auStack_188._0_8_ = local_208;
    auStack_188._8_8_ = dStack_200;
    auStack_178._0_8_ = local_1f8;
    auStack_178._8_8_ = dStack_1f0;
    auStack_168 = (undefined1  [8])local_1e8;
    local_160 = dStack_1e0;
    testProcrustesWithMatrix<float>((Matrix44<double> *)local_1d8);
    dVar3 = uStack_1d0 * 1.5;
    uStack_1d0._0_4_ = SUB84(dVar3,0);
    local_1d8 = (undefined1  [8])((double)local_1d8 * 1.5);
    uStack_1d0._4_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = stack0xfffffffffffffe40 * 1.5;
    auStack_1c8._8_4_ = SUB84(dVar3,0);
    auStack_1c8._0_8_ = (double)auStack_1c8._0_8_ * 1.5;
    uStack_1bc = (int)((ulong)dVar3 >> 0x20);
    dVar3 = local_1b0 * 6.400000095367432;
    unique0x100016a2 = SUB84(dVar3,0);
    auStack_1b8 = (undefined1  [8])((double)auStack_1b8 * 6.400000095367432);
    unique0x100016a6 = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_1a8._8_8_ * 6.400000095367432;
    auStack_1a8._8_4_ = SUB84(dVar3,0);
    auStack_1a8._0_8_ = (double)auStack_1a8._0_8_ * 6.400000095367432;
    auStack_1a8._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_198._8_8_ + (double)auStack_198._8_8_;
    auStack_198._8_4_ = SUB84(dVar3,0);
    auStack_198._0_8_ = (double)auStack_198._0_8_ + (double)auStack_198._0_8_;
    auStack_198._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_188._8_8_ + (double)auStack_188._8_8_;
    auStack_188._8_4_ = SUB84(dVar3,0);
    auStack_188._0_8_ = (double)auStack_188._0_8_ + (double)auStack_188._0_8_;
    auStack_188._12_4_ = (int)((ulong)dVar3 >> 0x20);
    testProcrustesWithMatrix<float>((M44d *)local_1d8);
    Imath_2_5::Euler<double>::toMatrix44(&local_138,&local_158);
    local_1e8 = 0.0;
    dStack_1e0 = 0.0;
    local_1f8 = 0.0;
    dStack_1f0 = 0.0;
    local_208 = 0.0;
    dStack_200 = 0.0;
    local_218 = 0.0;
    dStack_210 = 0.0;
    local_228 = 0.0;
    dStack_220 = 0.0;
    local_238 = 0.0;
    dStack_230 = 0.0;
    dStack_248 = 0.0;
    dStack_240 = 0.0;
    local_258 = (undefined1  [4])0x0;
    fStack_254 = 0.0;
    fStack_250 = 0.0;
    uStack_24c = 0;
    Imath_2_5::Matrix44<double>::multiply
              ((Matrix44<double> *)local_1d8,&local_138,(Matrix44<double> *)local_258);
    auStack_178._8_8_ = dStack_1f0;
    auStack_178._0_8_ = local_1f8;
    local_160 = dStack_1e0;
    auStack_168 = (undefined1  [8])local_1e8;
    local_1d8 = (undefined1  [8])(CONCAT44(fStack_254,local_258) ^ 0x8000000000000000);
    uStack_1d0._0_4_ = fStack_250;
    uStack_1d0._4_4_ = uStack_24c ^ 0x80000000;
    auStack_1c8._0_8_ = (ulong)dStack_248 ^ 0x8000000000000000;
    auStack_1c8._8_4_ = SUB84(dStack_240,0);
    uStack_1bc = (uint)((ulong)dStack_240 >> 0x20) ^ 0x80000000;
    auStack_1b8 = (undefined1  [8])local_238;
    local_1b0 = dStack_230;
    auStack_1a8._0_8_ = local_228;
    auStack_1a8._8_8_ = dStack_220;
    auStack_198._0_8_ = local_218;
    auStack_198._8_8_ = dStack_210;
    auStack_188._0_8_ = local_208;
    auStack_188._8_8_ = dStack_200;
    testProcrustesWithMatrix<float>((Matrix44<double> *)local_1d8);
    dVar3 = local_1b0 * 0.0010000000474974513;
    unique0x1000170e = SUB84(dVar3,0);
    auStack_1b8 = (undefined1  [8])((double)auStack_1b8 * 0.0010000000474974513);
    unique0x10001712 = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_1a8._8_8_ * 0.0010000000474974513;
    auStack_1a8._8_4_ = SUB84(dVar3,0);
    auStack_1a8._0_8_ = (double)auStack_1a8._0_8_ * 0.0010000000474974513;
    auStack_1a8._12_4_ = (int)((ulong)dVar3 >> 0x20);
    testProcrustesWithMatrix<float>((M44d *)local_1d8);
    dVar3 = (double)auStack_198._8_8_ * 0.0;
    auStack_198._8_4_ = SUB84(dVar3,0);
    auStack_198._0_8_ = (double)auStack_198._0_8_ * 0.0;
    auStack_198._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dVar3 = (double)auStack_188._8_8_ * 0.0;
    auStack_188._8_4_ = SUB84(dVar3,0);
    auStack_188._0_8_ = (double)auStack_188._0_8_ * 0.0;
    auStack_188._12_4_ = (int)((ulong)dVar3 >> 0x20);
    testProcrustesWithMatrix<float>((M44d *)local_1d8);
    if (local_298.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.
                      super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.
                            super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.
                            super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_278.
        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.
                      super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_278.
                            super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.
                            super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                ,300,"void testProcrustesImp() [T = float]");
}

Assistant:

void
testProcrustesImp ()
{
    // Test the empty case:
    IMATH_INTERNAL_NAMESPACE::M44d id = 
        procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                          (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                          (T*) 0,
                                          0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    id = procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                           (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                           0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    // First we'll test with a bunch of known translation/rotation matrices
    // to make sure we get back exactly the same points:
    IMATH_INTERNAL_NAMESPACE::M44d m;
    m.makeIdentity();
    testTranslationRotationMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(3.0, 5.0, -0.2));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testTranslationRotationMatrix<T> (m);
    
    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testTranslationRotationMatrix<T> (m);

    m.makeIdentity();
    testWithTranslateRotateAndScale<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(0.4, 6.0, 10.0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(2.0, 2.0, 2.0));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(0.01, 0.01, 0.01));
    testWithTranslateRotateAndScale<T> (m);

    // Now we'll test with some random point sets and verify
    // the various Procrustes properties:
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;
    fromPoints.clear(); toPoints.clear();

    for (size_t i = 0; i < 4; ++i)
    {
        const T theta = T(2*i) / T(M_PI);
        fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta), sin(theta), 0));
        toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta + M_PI/3.0), sin(theta + M_PI/3.0), 0));
    }
    verifyProcrustes (fromPoints, toPoints);

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
        }
    }
    verifyProcrustes (fromPoints, toPoints);

    // Test with some known matrices of varying degrees of quality:
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(3, 4, 1));
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-10, 2, 1));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot (M_PI/3.0, 3.0*M_PI/4.0, 0);
    m = m * rot.toMatrix44();
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1.5, 6.4, 2.0));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot2 (1.0, M_PI, M_PI/3.0);
    m = m * rot.toMatrix44();

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-1, 1, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 0.001, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 1, 0));
    testProcrustesWithMatrix<T> (m);
}